

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_explode(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  uint uVar1;
  jx9_value *pObj;
  sxi32 sVar2;
  int iVar3;
  char *zString;
  jx9_value *pjVar4;
  jx9_value *pVal;
  int iVar5;
  ulong uVar6;
  char *pcVar7;
  sxu32 nLen;
  ulong uVar8;
  int nDelim;
  sxu32 nOfft;
  int nStrlen;
  int local_54;
  uint local_50;
  uint local_4c;
  jx9_context *local_48;
  char *local_40;
  int local_34;
  
  if ((1 < nArg) && (local_40 = jx9_value_to_string(*apArg,(int *)&local_50), 0 < (int)local_50)) {
    zString = jx9_value_to_string(apArg[1],&local_34);
    if (0 < (long)local_34) {
      pjVar4 = jx9_context_new_array(pCtx);
      pVal = jx9_context_new_scalar(pCtx);
      if (pVal != (jx9_value *)0x0 && pjVar4 != (jx9_value *)0x0) {
        pcVar7 = zString + local_34;
        local_54 = 0x7fffffff;
        local_48 = pCtx;
        if (nArg != 2) {
          pObj = apArg[2];
          jx9MemObjToInteger(pObj);
          iVar3 = *(int *)&pObj->x;
          iVar5 = -iVar3;
          if (0 < iVar3) {
            iVar5 = iVar3;
          }
          local_54 = iVar5 + -1 + (uint)(iVar5 == 0);
        }
        uVar6 = (ulong)local_50;
        do {
          nLen = (int)pcVar7 - (int)zString;
          sVar2 = SyBlobSearch(zString,nLen,local_40,(sxu32)uVar6,&local_4c);
          if (sVar2 != 0) {
LAB_00130765:
            jx9_value_string(pVal,zString,nLen);
            if ((pjVar4->iFlags & 0x40) != 0) {
              HashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,(jx9_value *)0x0,pVal);
            }
            break;
          }
          iVar3 = 0;
          if ((pjVar4->iFlags & 0x40) != 0) {
            iVar3 = *(int *)((pjVar4->x).iVal + 0x2c);
          }
          if (local_54 <= iVar3) goto LAB_00130765;
          uVar8 = (ulong)local_4c;
          if ((uVar8 != 0) &&
             (jx9_value_string(pVal,zString,local_4c), (pjVar4->iFlags & 0x40) != 0)) {
            HashmapInsert((jx9_hashmap *)(pjVar4->x).pOther,(jx9_value *)0x0,pVal);
          }
          uVar6 = (ulong)(int)local_50;
          (pVal->sBlob).nByte = 0;
          uVar1 = (pVal->sBlob).nFlags;
          if ((uVar1 & 4) != 0) {
            (pVal->sBlob).pBlob = (void *)0x0;
            (pVal->sBlob).mByte = 0;
            (pVal->sBlob).nFlags = uVar1 & 0xfffffffb;
          }
          zString = zString + uVar6 + uVar8;
        } while (zString < pcVar7);
        jx9_result_value(local_48,pjVar4);
        return 0;
      }
      pjVar4 = pCtx->pRet;
      goto LAB_0013065d;
    }
  }
  pjVar4 = pCtx->pRet;
LAB_0013065d:
  jx9MemObjRelease(pjVar4);
  (pjVar4->x).rVal = 0.0;
  pjVar4->iFlags = pjVar4->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_explode(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zDelim, *zString, *zCur, *zEnd;
	int nDelim, nStrlen, iLimit;
	jx9_value *pArray;
	jx9_value *pValue;
	sxu32 nOfft;
	sxi32 rc;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the delimiter */
	zDelim = jx9_value_to_string(apArg[0], &nDelim);
	if( nDelim < 1 ){
		/* Empty delimiter, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string */
	zString = jx9_value_to_string(apArg[1], &nStrlen);
	if( nStrlen < 1 ){
		/* Empty delimiter, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the end of the string */
	zEnd = &zString[nStrlen];
	/* Create the array */
	pArray =  jx9_context_new_array(pCtx);
	pValue = jx9_context_new_scalar(pCtx);
	if( pArray == 0 || pValue == 0 ){
		/* Out of memory, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Set a defualt limit */
	iLimit = SXI32_HIGH;
	if( nArg > 2 ){
		iLimit = jx9_value_to_int(apArg[2]);
		 if( iLimit < 0 ){
			iLimit = -iLimit;
		}
		if( iLimit == 0 ){
			iLimit = 1;
		}
		iLimit--;
	}
	/* Start exploding */
	for(;;){
		if( zString >= zEnd ){
			/* No more entry to process */
			break;
		}
		rc = SyBlobSearch(zString, (sxu32)(zEnd-zString), zDelim, nDelim, &nOfft);
		if( rc != SXRET_OK || iLimit <= (int)jx9_array_count(pArray) ){
			/* Limit reached, insert the rest of the string and break */
			if( zEnd > zString ){
				jx9_value_string(pValue, zString, (int)(zEnd-zString));
				jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pValue);
			}
			break;
		}
		/* Point to the desired offset */
		zCur = &zString[nOfft];
		if( zCur > zString ){
			/* Perform the store operation */
			jx9_value_string(pValue, zString, (int)(zCur-zString));
			jx9_array_add_elem(pArray, 0/* Automatic index assign*/, pValue);
		}
		/* Point beyond the delimiter */
		zString = &zCur[nDelim];
		/* Reset the cursor */
		jx9_value_reset_string_cursor(pValue);
	}
	/* Return the freshly created array */
	jx9_result_value(pCtx, pArray);
	/* NOTE that every allocated jx9_value will be automatically 
	 * released as soon we return from this foregin function.
	 */
	return JX9_OK;
}